

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_xml.cpp
# Opt level: O0

void __thiscall ON_XMLSegmentedStream::~ON_XMLSegmentedStream(ON_XMLSegmentedStream *this)

{
  ON_XMLSegmentedStream *this_local;
  
  ~ON_XMLSegmentedStream(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

ON_XMLSegmentedStream::~ON_XMLSegmentedStream()
{
  for (int i = 0; i < _private->m_a.Count(); i++)
  {
    delete[] _private->m_a[i];
  }

  delete _private;
}